

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::XFileImporter::InternReadFile
          (XFileImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  int iVar1;
  IOStream *__p;
  pointer pIVar2;
  DeadlyImportError *pDVar3;
  undefined4 extraout_var;
  reference pvVar4;
  Scene *pData;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  XFileParser parser;
  string local_d8;
  ulong local_b8;
  size_t fileSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  XFileImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar2 == (pointer)0x0) {
    fileSize._7_1_ = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_88);
    fileSize._7_1_ = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  iVar1 = (*pIVar2->_vptr_IOStream[6])();
  local_b8 = CONCAT44(extraout_var,iVar1);
  if (local_b8 < 0x10) {
    parser.mScene._6_1_ = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,"XFile is too small.",(allocator *)((long)&parser.mScene + 7));
    DeadlyImportError::DeadlyImportError(pDVar3,&local_d8);
    parser.mScene._6_1_ = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<char,_std::allocator<char>_>::resize(&this->mBuffer,local_b8 + 1);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  pvVar4 = std::vector<char,_std::allocator<char>_>::front(&this->mBuffer);
  (*pIVar2->_vptr_IOStream[2])(pIVar2,pvVar4,1,local_b8);
  BaseImporter::ConvertToUTF8(&this->mBuffer);
  XFileParser::XFileParser((XFileParser *)local_118,&this->mBuffer);
  pData = XFileParser::GetImportedData((XFileParser *)local_118);
  CreateDataRepresentationFromImport(this,pScene,pData);
  if (pScene->mRootNode == (aiNode *)0x0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_138,"XFile is ill-formatted - no content imported.",&local_139);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_138);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  XFileParser::~XFileParser((XFileParser *)local_118);
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void XFileImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    // read file into memory
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));
    if ( file.get() == NULL ) {
        throw DeadlyImportError( "Failed to open file " + pFile + "." );
    }

    static const size_t MinSize = 16;
    size_t fileSize = file->FileSize();
    if ( fileSize < MinSize ) {
        throw DeadlyImportError( "XFile is too small." );
    }

    // in the hope that binary files will never start with a BOM ...
    mBuffer.resize( fileSize + 1);
    file->Read( &mBuffer.front(), 1, fileSize);
    ConvertToUTF8(mBuffer);

    // parse the file into a temporary representation
    XFileParser parser( mBuffer);

    // and create the proper return structures out of it
    CreateDataRepresentationFromImport( pScene, parser.GetImportedData());

    // if nothing came from it, report it as error
    if ( !pScene->mRootNode ) {
        throw DeadlyImportError( "XFile is ill-formatted - no content imported." );
    }
}